

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_creader_set_null(Curl_easy *data)

{
  CURLcode CVar1;
  Curl_creader *r;
  
  CVar1 = Curl_creader_create(&r,data,&cr_null,CURL_CR_CLIENT);
  if (CVar1 != CURLE_OK) {
    return CVar1;
  }
  cl_reset_reader(data);
  CVar1 = do_init_reader_stack(data,r);
  return CVar1;
}

Assistant:

CURLcode Curl_creader_set_null(struct Curl_easy *data)
{
  struct Curl_creader *r;
  CURLcode result;

  result = Curl_creader_create(&r, data, &cr_null, CURL_CR_CLIENT);
  if(result)
    return result;

  cl_reset_reader(data);
  return do_init_reader_stack(data, r);
}